

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

word * Vec_MemGetEntry(Vec_Mem_t *p,int i)

{
  int iVar1;
  word *pwVar2;
  int local_3c;
  word **local_38;
  int local_2c;
  int local_18;
  int iPageNew;
  int k;
  int i_local;
  Vec_Mem_t *p_local;
  
  if (-1 < i) {
    if (p->nEntries <= i) {
      iVar1 = i >> ((byte)p->LogPageSze & 0x1f);
      if (p->iPage < iVar1) {
        if (p->nPageAlloc <= iVar1) {
          if (p->ppPages == (word **)0x0) {
            if (p->nPageAlloc == 0) {
              local_3c = iVar1 + 0x20;
            }
            else {
              local_3c = p->nPageAlloc << 1;
            }
            p->nPageAlloc = local_3c;
            local_38 = (word **)malloc((long)local_3c << 3);
          }
          else {
            if (p->nPageAlloc == 0) {
              local_2c = iVar1 + 0x20;
            }
            else {
              local_2c = p->nPageAlloc << 1;
            }
            p->nPageAlloc = local_2c;
            local_38 = (word **)realloc(p->ppPages,(long)local_2c << 3);
          }
          p->ppPages = local_38;
        }
        local_18 = p->iPage;
        while (local_18 = local_18 + 1, local_18 <= iVar1) {
          pwVar2 = (word *)malloc((long)(p->nEntrySize * (1 << ((byte)p->LogPageSze & 0x1f))) << 3);
          p->ppPages[local_18] = pwVar2;
        }
        p->iPage = iVar1;
      }
      p->nEntries = i + 1;
    }
    pwVar2 = Vec_MemReadEntry(p,i);
    return pwVar2;
  }
  __assert_fail("i >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
}

Assistant:

static inline word * Vec_MemGetEntry( Vec_Mem_t * p, int i )
{
    assert( i >= 0 );
    if ( i >= p->nEntries )
    {
        int k, iPageNew = (i >> p->LogPageSze);
        if ( p->iPage < iPageNew )
        {
            // realloc page pointers if needed
            if ( iPageNew >= p->nPageAlloc )
                p->ppPages = ABC_REALLOC( word *, p->ppPages, (p->nPageAlloc = p->nPageAlloc ? 2 * p->nPageAlloc : iPageNew + 32) );
            // allocate new pages if needed
            for ( k = p->iPage + 1; k <= iPageNew; k++ )
                p->ppPages[k] = ABC_ALLOC( word, p->nEntrySize * (1 << p->LogPageSze) );
            // update page counter
            p->iPage = iPageNew;
        }
        // update entry counter
        p->nEntries = i + 1;
    }
    return Vec_MemReadEntry( p, i );
}